

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O3

bool __thiscall
TorControlConnection::Connect
          (TorControlConnection *this,string *tor_control_center,ConnectionCB *_connected,
          ConnectionCB *_disconnected)

{
  DNSLookupFn dns_lookup_function;
  bool bVar1;
  int iVar2;
  bufferevent *pbVar3;
  char *fmt;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined1 auStack_118 [12];
  socklen_t control_address_len;
  _Any_data local_108;
  code *local_f8;
  sockaddr_storage control_address;
  _Storage<CService,_false> local_68;
  char local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->b_conn != (bufferevent *)0x0) {
    bufferevent_free();
    this->b_conn = (bufferevent *)0x0;
  }
  bVar1 = fNameLookup;
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_108,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._12_4_ = control_address_len;
  dns_lookup_function.super__Function_base._M_functor._0_12_ = auStack_118;
  dns_lookup_function._16_16_ = local_108;
  Lookup((optional<CService> *)&local_68._M_value,tor_control_center,0x235b,bVar1,
         dns_lookup_function);
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if (local_40 == '\0') {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "Connect";
    logging_function._M_len = 7;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x99,ALL,Info,
               "tor: Failed to look up control center %s\n",tor_control_center);
  }
  else {
    control_address_len = 0x80;
    bVar1 = CService::GetSockAddr
                      (&local_68._M_value,(sockaddr *)&control_address,&control_address_len);
    if (bVar1) {
      pbVar3 = (bufferevent *)bufferevent_socket_new(this->base,0xffffffff,1);
      this->b_conn = pbVar3;
      if (pbVar3 == (bufferevent *)0x0) goto LAB_00abbfe2;
      bufferevent_setcb(pbVar3,readcb,0,eventcb,this);
      bufferevent_enable(this->b_conn,6);
      std::function<void_(TorControlConnection_&)>::operator=(&this->connected,_connected);
      std::function<void_(TorControlConnection_&)>::operator=(&this->disconnected,_disconnected);
      iVar2 = bufferevent_socket_connect(this->b_conn,&control_address,control_address_len);
      bVar1 = true;
      if (-1 < iVar2) goto LAB_00abbfe4;
      fmt = "tor: Error connecting to address %s\n";
      iVar2 = 0xb0;
    }
    else {
      fmt = "tor: Error parsing socket address %s\n";
      iVar2 = 0xa0;
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_00._M_len = 0x57;
    logging_function_00._M_str = "Connect";
    logging_function_00._M_len = 7;
    ::LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,iVar2,ALL,Info,fmt,tor_control_center);
  }
LAB_00abbfe2:
  bVar1 = false;
LAB_00abbfe4:
  if ((local_40 == '\x01') &&
     (local_40 = '\0', 0x10 < local_68._M_value.super_CNetAddr.m_addr._size)) {
    free((void *)local_68._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool TorControlConnection::Connect(const std::string& tor_control_center, const ConnectionCB& _connected, const ConnectionCB& _disconnected)
{
    if (b_conn) {
        Disconnect();
    }

    const std::optional<CService> control_service{Lookup(tor_control_center, DEFAULT_TOR_CONTROL_PORT, fNameLookup)};
    if (!control_service.has_value()) {
        LogPrintf("tor: Failed to look up control center %s\n", tor_control_center);
        return false;
    }

    struct sockaddr_storage control_address;
    socklen_t control_address_len = sizeof(control_address);
    if (!control_service.value().GetSockAddr(reinterpret_cast<struct sockaddr*>(&control_address), &control_address_len)) {
        LogPrintf("tor: Error parsing socket address %s\n", tor_control_center);
        return false;
    }

    // Create a new socket, set up callbacks and enable notification bits
    b_conn = bufferevent_socket_new(base, -1, BEV_OPT_CLOSE_ON_FREE);
    if (!b_conn) {
        return false;
    }
    bufferevent_setcb(b_conn, TorControlConnection::readcb, nullptr, TorControlConnection::eventcb, this);
    bufferevent_enable(b_conn, EV_READ|EV_WRITE);
    this->connected = _connected;
    this->disconnected = _disconnected;

    // Finally, connect to tor_control_center
    if (bufferevent_socket_connect(b_conn, reinterpret_cast<struct sockaddr*>(&control_address), control_address_len) < 0) {
        LogPrintf("tor: Error connecting to address %s\n", tor_control_center);
        return false;
    }
    return true;
}